

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

void destroyShellObjects(_GLFWwindow *window)

{
  anon_struct_32_4_6d1cac34_for_xdg *paVar1;
  libdecor_frame *plVar2;
  wl_proxy *pwVar3;
  PFN_wl_proxy_marshal_flags p_Var4;
  uint32_t uVar5;
  
  destroyFallbackDecorations(window);
  plVar2 = (window->wl).libdecor.frame;
  if (plVar2 != (libdecor_frame *)0x0) {
    (*_glfw.wl.libdecor.libdecor_frame_unref_)(plVar2);
  }
  p_Var4 = _glfw.wl.client.proxy_marshal_flags;
  pwVar3 = (wl_proxy *)(window->wl).xdg.decoration;
  if (pwVar3 != (wl_proxy *)0x0) {
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar3);
    (*p_Var4)(pwVar3,0,(wl_interface *)0x0,uVar5,1);
  }
  p_Var4 = _glfw.wl.client.proxy_marshal_flags;
  paVar1 = &(window->wl).xdg;
  pwVar3 = (wl_proxy *)(window->wl).xdg.toplevel;
  if (pwVar3 != (wl_proxy *)0x0) {
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar3);
    (*p_Var4)(pwVar3,0,(wl_interface *)0x0,uVar5,1);
  }
  p_Var4 = _glfw.wl.client.proxy_marshal_flags;
  pwVar3 = (wl_proxy *)paVar1->surface;
  if (pwVar3 != (wl_proxy *)0x0) {
    uVar5 = (*_glfw.wl.client.proxy_get_version)(pwVar3);
    (*p_Var4)(pwVar3,0,(wl_interface *)0x0,uVar5,1);
  }
  (window->wl).libdecor.frame = (libdecor_frame *)0x0;
  *(undefined8 *)((long)&(window->wl).xdg.toplevel + 4) = 0;
  *(undefined8 *)((long)&(window->wl).xdg.decoration + 4) = 0;
  paVar1->surface = (xdg_surface *)0x0;
  (window->wl).xdg.toplevel = (xdg_toplevel *)0x0;
  return;
}

Assistant:

static void destroyShellObjects(_GLFWwindow* window)
{
    destroyFallbackDecorations(window);

    if (window->wl.libdecor.frame)
        libdecor_frame_unref(window->wl.libdecor.frame);

    if (window->wl.xdg.decoration)
        zxdg_toplevel_decoration_v1_destroy(window->wl.xdg.decoration);

    if (window->wl.xdg.toplevel)
        xdg_toplevel_destroy(window->wl.xdg.toplevel);

    if (window->wl.xdg.surface)
        xdg_surface_destroy(window->wl.xdg.surface);

    window->wl.libdecor.frame = NULL;
    window->wl.xdg.decoration = NULL;
    window->wl.xdg.decorationMode = 0;
    window->wl.xdg.toplevel = NULL;
    window->wl.xdg.surface = NULL;
}